

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef
CompileLlvmExternalFunctionWrapper(LlvmCompilationContext *ctx,FunctionData *functionData)

{
  LLVMValueRef pLVar1;
  LLVMValueRef pLVar2;
  FunctionData *pFVar3;
  LLVMBuilderRef pLVar4;
  LLVMBuilderRef pLVar5;
  bool bVar6;
  int iVar7;
  LLVMValueRefOpaque **ppLVar8;
  LLVMBasicBlockRef pLVar9;
  LLVMTypeRef pLVar10;
  LLVMValueRef pLVar11;
  LLVMValueRef pLVar12;
  LLVMValueRef pLVar13;
  int local_1a4;
  LLVMValueRef local_160;
  LLVMValueRef local_140;
  LLVMValueRef result_1;
  LLVMValueRef argument_3;
  LLVMValueRef result;
  LLVMValueRef local_120;
  LLVMValueRef local_118 [3];
  LLVMValueRef local_100;
  undefined1 local_f8 [8];
  SmallArray<LLVMValueRefOpaque_*,_3U> arguments;
  LLVMValueRef argument_2;
  LLVMValueRef address_1;
  LLVMValueRef indices_1 [2];
  VariableData *variable_1;
  LLVMValueRef argument_1;
  LLVMValueRef argument;
  LLVMValueRef target;
  TypeBase *argumentType;
  LLVMValueRef address;
  LLVMValueRef indices [2];
  VariableData *variable;
  VariableHandle *curr;
  uint argBufferPos;
  uint argIndex;
  LLVMValueRef retBuffer;
  TypeBase *returnType;
  LLVMValueRef argBuffer;
  LLVMBasicBlockRef block;
  FunctionData *currentFunctionSource;
  LLVMValueRef currentFunction;
  LLVMValueRef function;
  FunctionData *functionData_local;
  LlvmCompilationContext *ctx_local;
  
  ppLVar8 = SmallArray<LLVMValueRefOpaque_*,_128U>::operator[]
                      (&ctx->functions,functionData->functionIndex);
  pLVar1 = *ppLVar8;
  pLVar2 = ctx->currentFunction;
  pFVar3 = ctx->currentFunctionSource;
  ctx->currentFunction = pLVar1;
  ctx->currentFunctionSource = functionData;
  pLVar9 = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"start");
  LLVMPositionBuilderAtEnd(ctx->builder,pLVar9);
  pLVar4 = ctx->builder;
  pLVar10 = LLVMInt8TypeInContext(ctx->context);
  pLVar10 = LLVMArrayType(pLVar10,(uint)functionData->argumentsSize);
  pLVar11 = LLVMBuildAlloca(pLVar4,pLVar10,"arg_buffer");
  retBuffer = (LLVMValueRef)functionData->type->returnType;
  bVar6 = isType<TypeBool>((TypeBase *)retBuffer);
  if (((bVar6) || (bVar6 = isType<TypeChar>((TypeBase *)retBuffer), bVar6)) ||
     (bVar6 = isType<TypeShort>((TypeBase *)retBuffer), bVar6)) {
    retBuffer = (LLVMValueRef)ctx->ctx->typeInt;
  }
  if ((TypeBase *)retBuffer == ctx->ctx->typeVoid) {
    local_160 = (LLVMValueRef)0x0;
  }
  else {
    pLVar4 = ctx->builder;
    pLVar10 = LLVMInt8TypeInContext(ctx->context);
    pLVar10 = LLVMArrayType(pLVar10,(uint)*(undefined8 *)(retBuffer + 0x30));
    local_160 = LLVMBuildAlloca(pLVar4,pLVar10,"ret_buffer");
  }
  curr._0_4_ = 0;
  bVar6 = IsStructReturnType(functionData->type->returnType);
  curr._4_4_ = (uint)bVar6;
  for (variable = (VariableData *)(functionData->argumentVariables).head;
      variable != (VariableData *)0x0; variable = (VariableData *)variable->scope) {
    indices[1] = (LLVMValueRef)variable->importModule;
    pLVar10 = LLVMInt32TypeInContext(ctx->context);
    address = LLVMConstInt(pLVar10,0,true);
    pLVar10 = LLVMInt32TypeInContext(ctx->context);
    indices[0] = LLVMConstInt(pLVar10,(ulong)(uint)curr,true);
    pLVar12 = LLVMBuildGEP(ctx->builder,pLVar11,&address,2,"");
    target = *(LLVMValueRef *)(indices[1] + 0x20);
    bVar6 = isType<TypeBool>((TypeBase *)target);
    if (((bVar6) || (bVar6 = isType<TypeChar>((TypeBase *)target), bVar6)) ||
       (bVar6 = isType<TypeShort>((TypeBase *)target), bVar6)) {
      target = (LLVMValueRef)ctx->ctx->typeInt;
    }
    pLVar4 = ctx->builder;
    pLVar10 = CompileLlvmType(ctx,(TypeBase *)target);
    pLVar10 = LLVMPointerType(pLVar10,0);
    pLVar12 = LLVMBuildPointerCast(pLVar4,pLVar12,pLVar10,"arg_buffer_pos");
    bVar6 = IsStructArgumentType((TypeBase *)target);
    if (bVar6) {
      pLVar13 = LLVMGetParam(pLVar1,curr._4_4_);
      pLVar4 = ctx->builder;
      pLVar13 = LLVMBuildLoad(ctx->builder,pLVar13,"");
      LLVMBuildStore(pLVar4,pLVar13,pLVar12);
    }
    else {
      variable_1 = (VariableData *)LLVMGetParam(pLVar1,curr._4_4_);
      if (target != *(LLVMValueRef *)(indices[1] + 0x20)) {
        bVar6 = isType<TypeBool>(*(TypeBase **)(indices[1] + 0x20));
        if (bVar6) {
          pLVar4 = ctx->builder;
          pLVar10 = CompileLlvmType(ctx,(TypeBase *)target);
          variable_1 = (VariableData *)LLVMBuildZExt(pLVar4,(LLVMValueRef)variable_1,pLVar10,"");
        }
        else {
          pLVar4 = ctx->builder;
          pLVar10 = CompileLlvmType(ctx,(TypeBase *)target);
          variable_1 = (VariableData *)LLVMBuildSExt(pLVar4,(LLVMValueRef)variable_1,pLVar10,"");
        }
      }
      LLVMBuildStore(ctx->builder,(LLVMValueRef)variable_1,pLVar12);
    }
    curr._4_4_ = curr._4_4_ + 1;
    if (*(long *)(target + 0x30) == 0) {
      local_1a4 = 4;
    }
    else {
      local_1a4 = (int)*(undefined8 *)(target + 0x30);
    }
    curr._0_4_ = local_1a4 + (uint)curr;
  }
  indices_1[1] = (LLVMValueRef)functionData->contextArgument;
  if ((VariableData *)indices_1[1] == (VariableData *)0x0) {
    curr._0_4_ = (uint)curr + 8;
  }
  else {
    pLVar10 = LLVMInt32TypeInContext(ctx->context);
    address_1 = LLVMConstInt(pLVar10,0,true);
    pLVar10 = LLVMInt32TypeInContext(ctx->context);
    indices_1[0] = LLVMConstInt(pLVar10,(ulong)(uint)curr,true);
    pLVar12 = LLVMBuildGEP(ctx->builder,pLVar11,&address_1,2,"");
    pLVar13 = LLVMGetParam(pLVar1,curr._4_4_);
    pLVar4 = ctx->builder;
    arguments.allocator = (Allocator *)pLVar13;
    pLVar10 = CompileLlvmType(ctx,functionData->contextType);
    pLVar13 = LLVMBuildPointerCast(pLVar4,pLVar13,pLVar10,"context_reinterpret");
    pLVar4 = ctx->builder;
    pLVar5 = ctx->builder;
    arguments.allocator = (Allocator *)pLVar13;
    pLVar10 = CompileLlvmType(ctx,*(TypeBase **)(indices_1[1] + 0x20));
    pLVar10 = LLVMPointerType(pLVar10,0);
    pLVar12 = LLVMBuildPointerCast(pLVar5,pLVar12,pLVar10,"arg_buffer_pos");
    LLVMBuildStore(pLVar4,pLVar13,pLVar12);
    curr._0_4_ = (int)*(undefined8 *)(*(long *)(indices_1[1] + 0x20) + 0x30) + (uint)curr;
  }
  if ((uint)curr == (int)functionData->argumentsSize) {
    if (((functionData->coroutine ^ 0xffU) & 1) == 0) {
      __assert_fail("!functionData->coroutine",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                    ,0x954,
                    "LLVMValueRef CompileLlvmExternalFunctionWrapper(LlvmCompilationContext &, FunctionData *)"
                   );
    }
    SmallArray<LLVMValueRefOpaque_*,_3U>::SmallArray
              ((SmallArray<LLVMValueRefOpaque_*,_3U> *)local_f8,ctx->allocator);
    pLVar10 = CompileLlvmType(ctx,ctx->ctx->typeInt);
    local_100 = LLVMConstInt(pLVar10,(ulong)functionData->functionIndex,true);
    SmallArray<LLVMValueRefOpaque_*,_3U>::push_back
              ((SmallArray<LLVMValueRefOpaque_*,_3U> *)local_f8,&local_100);
    pLVar4 = ctx->builder;
    pLVar10 = CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
    local_118[0] = LLVMBuildPointerCast(pLVar4,pLVar11,pLVar10,"arg_buffer_raw_ptr");
    SmallArray<LLVMValueRefOpaque_*,_3U>::push_back
              ((SmallArray<LLVMValueRefOpaque_*,_3U> *)local_f8,local_118);
    if (local_160 == (LLVMValueRef)0x0) {
      pLVar10 = CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
      result = LLVMConstPointerNull(pLVar10);
      SmallArray<LLVMValueRefOpaque_*,_3U>::push_back
                ((SmallArray<LLVMValueRefOpaque_*,_3U> *)local_f8,&result);
    }
    else {
      pLVar4 = ctx->builder;
      pLVar10 = CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
      local_120 = LLVMBuildPointerCast(pLVar4,local_160,pLVar10,"ret_buffer_raw_ptr");
      SmallArray<LLVMValueRefOpaque_*,_3U>::push_back
                ((SmallArray<LLVMValueRefOpaque_*,_3U> *)local_f8,&local_120);
    }
    pLVar4 = ctx->builder;
    pLVar11 = LLVMGetNamedFunction(ctx->module,"__llvmExternalCall");
    LLVMBuildCall(pLVar4,pLVar11,(LLVMValueRef *)local_f8,(uint)arguments.data,"");
    SmallArray<LLVMValueRefOpaque_*,_3U>::~SmallArray
              ((SmallArray<LLVMValueRefOpaque_*,_3U> *)local_f8);
    if (functionData->type->returnType == ctx->ctx->typeVoid) {
      LLVMBuildRetVoid(ctx->builder);
    }
    else {
      bVar6 = IsStructReturnType(functionData->type->returnType);
      if (bVar6) {
        pLVar4 = ctx->builder;
        pLVar5 = ctx->builder;
        pLVar10 = CompileLlvmType(ctx,functionData->type->returnType);
        pLVar10 = LLVMPointerType(pLVar10,0);
        pLVar11 = LLVMBuildPointerCast(pLVar5,local_160,pLVar10,"result_ptr");
        pLVar11 = LLVMBuildLoad(pLVar4,pLVar11,"result");
        pLVar12 = LLVMGetParam(pLVar1,0);
        LLVMBuildStore(ctx->builder,pLVar11,pLVar12);
        LLVMBuildRetVoid(ctx->builder);
      }
      else {
        pLVar4 = ctx->builder;
        pLVar5 = ctx->builder;
        pLVar10 = CompileLlvmType(ctx,(TypeBase *)retBuffer);
        pLVar10 = LLVMPointerType(pLVar10,0);
        pLVar11 = LLVMBuildPointerCast(pLVar5,local_160,pLVar10,"result_ptr");
        local_140 = LLVMBuildLoad(pLVar4,pLVar11,"result");
        if ((TypeBase *)retBuffer != functionData->type->returnType) {
          pLVar4 = ctx->builder;
          pLVar10 = CompileLlvmType(ctx,functionData->type->returnType);
          local_140 = LLVMBuildTrunc(pLVar4,local_140,pLVar10,"");
        }
        LLVMBuildRet(ctx->builder,local_140);
      }
    }
    CheckFunction(ctx,ctx->currentFunction,functionData->name->name);
    iVar7 = LLVMRunFunctionPassManager(ctx->functionPassManager,pLVar1);
    if (iVar7 != 0) {
      LLVMRunFunctionPassManager(ctx->functionPassManager,pLVar1);
    }
    ctx->currentFunction = pLVar2;
    ctx->currentFunctionSource = pFVar3;
    return (LLVMValueRef)0x0;
  }
  __assert_fail("argBufferPos == unsigned(functionData->argumentsSize)",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x952,
                "LLVMValueRef CompileLlvmExternalFunctionWrapper(LlvmCompilationContext &, FunctionData *)"
               );
}

Assistant:

LLVMValueRef CompileLlvmExternalFunctionWrapper(LlvmCompilationContext &ctx, FunctionData *functionData)
{
	LLVMValueRef function = ctx.functions[functionData->functionIndex];

	// Store state
	LLVMValueRef currentFunction = ctx.currentFunction;
	FunctionData *currentFunctionSource = ctx.currentFunctionSource;

	// Switch to new function
	ctx.currentFunction = function;
	ctx.currentFunctionSource = functionData;

	LLVMBasicBlockRef block = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "start");

	LLVMPositionBuilderAtEnd(ctx.builder, block);

	// Create argument buffer
	LLVMValueRef argBuffer = LLVMBuildAlloca(ctx.builder, LLVMArrayType(LLVMInt8TypeInContext(ctx.context), unsigned(functionData->argumentsSize)), "arg_buffer");

	// Return small numeric types as 'int'
	TypeBase *returnType = functionData->type->returnType;

	if(isType<TypeBool>(returnType) || isType<TypeChar>(returnType) || isType<TypeShort>(returnType))
		returnType = ctx.ctx.typeInt;

	// Create return buffer
	LLVMValueRef retBuffer = returnType == ctx.ctx.typeVoid ? NULL : LLVMBuildAlloca(ctx.builder, LLVMArrayType(LLVMInt8TypeInContext(ctx.context), unsigned(returnType->size)), "ret_buffer");

	// Copy all arguments into argument buffer
	unsigned argIndex = 0;
	unsigned argBufferPos = 0;

	if(IsStructReturnType(functionData->type->returnType))
		argIndex++;

	for(VariableHandle *curr = functionData->argumentVariables.head; curr; curr = curr->next)
	{
		VariableData *variable = curr->variable;

		LLVMValueRef indices[] = { LLVMConstInt(LLVMInt32TypeInContext(ctx.context), 0, true), LLVMConstInt(LLVMInt32TypeInContext(ctx.context), argBufferPos, true) };

		LLVMValueRef address = LLVMBuildGEP(ctx.builder, argBuffer, indices, 2, "");

		TypeBase *argumentType = variable->type;

		// Pass small numeric types as 'int'
		if(isType<TypeBool>(argumentType) || isType<TypeChar>(argumentType) || isType<TypeShort>(argumentType))
			argumentType = ctx.ctx.typeInt;

		LLVMValueRef target = LLVMBuildPointerCast(ctx.builder, address, LLVMPointerType(CompileLlvmType(ctx, argumentType), 0), "arg_buffer_pos");

		if(IsStructArgumentType(argumentType))
		{
			LLVMValueRef argument = LLVMGetParam(function, argIndex++);

			LLVMBuildStore(ctx.builder, LLVMBuildLoad(ctx.builder, argument, ""), target);
		}
		else
		{
			LLVMValueRef argument = LLVMGetParam(function, argIndex++);

			if(argumentType != variable->type)
			{
				if(isType<TypeBool>(variable->type))
					argument = LLVMBuildZExt(ctx.builder, argument, CompileLlvmType(ctx, argumentType), "");
				else
					argument = LLVMBuildSExt(ctx.builder, argument, CompileLlvmType(ctx, argumentType), "");
			}

			LLVMBuildStore(ctx.builder, argument, target);
		}

		argBufferPos += argumentType->size == 0 ? 4u : unsigned(argumentType->size);
	}

	if(VariableData *variable = functionData->contextArgument)
	{
		LLVMValueRef indices[] = { LLVMConstInt(LLVMInt32TypeInContext(ctx.context), 0, true), LLVMConstInt(LLVMInt32TypeInContext(ctx.context), argBufferPos, true) };

		LLVMValueRef address = LLVMBuildGEP(ctx.builder, argBuffer, indices, 2, "");

		LLVMValueRef argument = LLVMGetParam(function, argIndex++);

		argument = LLVMBuildPointerCast(ctx.builder, argument, CompileLlvmType(ctx, functionData->contextType), "context_reinterpret");

		LLVMBuildStore(ctx.builder, argument, LLVMBuildPointerCast(ctx.builder, address, LLVMPointerType(CompileLlvmType(ctx, variable->type), 0), "arg_buffer_pos"));

		argBufferPos += unsigned(variable->type->size);
	}
	else
	{
		argBufferPos += NULLC_PTR_SIZE;
	}

	assert(argBufferPos == unsigned(functionData->argumentsSize));

	assert(!functionData->coroutine);

	// Call helper function
	{
		SmallArray<LLVMValueRef, 3> arguments(ctx.allocator);

		arguments.push_back(LLVMConstInt(CompileLlvmType(ctx, ctx.ctx.typeInt), functionData->functionIndex, true));
		arguments.push_back(LLVMBuildPointerCast(ctx.builder, argBuffer, CompileLlvmType(ctx, ctx.ctx.typeNullPtr), "arg_buffer_raw_ptr"));

		if(retBuffer)
			arguments.push_back(LLVMBuildPointerCast(ctx.builder, retBuffer, CompileLlvmType(ctx, ctx.ctx.typeNullPtr), "ret_buffer_raw_ptr"));
		else
			arguments.push_back(LLVMConstPointerNull(CompileLlvmType(ctx, ctx.ctx.typeNullPtr)));

		LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmExternalCall"), arguments.data, arguments.count, "");
	}

	if(functionData->type->returnType == ctx.ctx.typeVoid)
	{
		LLVMBuildRetVoid(ctx.builder);
	}
	else if(IsStructReturnType(functionData->type->returnType))
	{
		LLVMValueRef result = LLVMBuildLoad(ctx.builder, LLVMBuildPointerCast(ctx.builder, retBuffer, LLVMPointerType(CompileLlvmType(ctx, functionData->type->returnType), 0), "result_ptr"), "result");

		LLVMValueRef argument = LLVMGetParam(function, 0);

		LLVMBuildStore(ctx.builder, result, argument);

		LLVMBuildRetVoid(ctx.builder);
	}
	else
	{
		LLVMValueRef result = LLVMBuildLoad(ctx.builder, LLVMBuildPointerCast(ctx.builder, retBuffer, LLVMPointerType(CompileLlvmType(ctx, returnType), 0), "result_ptr"), "result");

		if(returnType != functionData->type->returnType)
			result = LLVMBuildTrunc(ctx.builder, result, CompileLlvmType(ctx, functionData->type->returnType), "");

		LLVMBuildRet(ctx.builder, result);
	}

	CheckFunction(ctx, ctx.currentFunction, functionData->name->name);

	if(LLVMRunFunctionPassManager(ctx.functionPassManager, function))
		LLVMRunFunctionPassManager(ctx.functionPassManager, function);

	// Restore state
	ctx.currentFunction = currentFunction;
	ctx.currentFunctionSource = currentFunctionSource;

	return NULL;
}